

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O0

int CVmObjCharSet::is_rt_mappable(wchar_t c,CCharmapToLocal *to_local,CCharmapToUni *to_uni)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  size_t sVar5;
  long *in_RDX;
  long *in_RSI;
  wchar_t in_EDI;
  char *p;
  size_t unilen;
  size_t lcllen;
  char unibuf [16];
  char lclbuf [16];
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffac;
  CCharmapToLocal *in_stack_ffffffffffffffb0;
  CCharmapToLocal *in_stack_ffffffffffffffb8;
  char local_38 [16];
  undefined1 local_28 [16];
  long *local_18;
  wchar_t local_8;
  uint local_4;
  
  local_18 = in_RDX;
  local_8 = in_EDI;
  iVar1 = (**(code **)(*in_RSI + 0x30))(in_RSI,in_EDI);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pwVar3 = CCharmapToLocal::get_expansion
                       (in_stack_ffffffffffffffb8,
                        (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pwVar3 == (wchar_t *)0x0) {
      sVar4 = CCharmapToLocal::map_char
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      sVar4 = (**(code **)(*local_18 + 0x20))
                        (local_18,&stack0xffffffffffffffb0,&stack0xffffffffffffffb8,local_28,sVar4);
      sVar5 = utf8_ptr::s_wchar_size(local_8);
      local_4 = 0;
      if (sVar4 == sVar5) {
        wVar2 = utf8_ptr::s_getch(local_38);
        local_4 = (uint)(wVar2 == local_8) << 0x18;
      }
      local_4 = local_4 >> 0x18;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVmObjCharSet::is_rt_mappable(wchar_t c, CCharmapToLocal *to_local,
                                  CCharmapToUni *to_uni)
{
    char lclbuf[16];
    char unibuf[16];
    size_t lcllen;
    size_t unilen;
    char *p;

    /* if there's no local mapping, it's obviously not mappable */
    if (!to_local->is_mappable(c))
        return FALSE;

    /* 
     *   If there's an expansion in the mapping to the local set, then there
     *   can't be a round-trip mapping.  Expansions are inherently one-way
     *   because they produce multiple local characters for a single unicode
     *   character, and the reverse mapping has no way to group those
     *   multiple local characters back into a single unicode character.  
     */
    if (to_local->get_expansion(c, &lcllen) != 0)
        return FALSE;

    /* get the local mapping */
    lcllen = to_local->map_char(c, lclbuf, sizeof(lclbuf));

    /* map it back to unicode */
    p = unibuf;
    unilen = sizeof(unibuf);
    unilen = to_uni->map(&p, &unilen, lclbuf, lcllen);

    /* 
     *   if the unicode mapping is one character that exactly matches the
     *   original input character, then we have a valid round-trip mapping 
     */
    return (unilen == utf8_ptr::s_wchar_size(c)
            && utf8_ptr::s_getch(unibuf) == c);
}